

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::InvalidTargetTest::InvalidTargetTest(InvalidTargetTest *this,Context *context)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_98 [8];
  testCase test_case_3;
  GLenum dst_target_3;
  GLenum src_target_3;
  GLuint dst_3;
  GLuint src_3;
  testCase test_case_2;
  GLenum dst_target_2;
  GLenum src_target_2;
  GLuint dst_2;
  GLuint src_2;
  testCase test_case_1;
  GLenum dst_target_1;
  GLenum src_target_1;
  GLuint dst_1;
  GLuint src_1;
  undefined1 local_34 [8];
  testCase test_case;
  GLenum dst_target;
  GLenum src_target;
  GLuint dst;
  GLuint src;
  Context *context_local;
  InvalidTargetTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"invalid_target",
             "Test verifies if INVALID_ENUM is generated when invalid target is provided to CopySubImageData"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InvalidTargetTest_0322e5e0;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (src_target = 0; src_target < 0xb; src_target = src_target + 1) {
    for (dst_target = 0; dst_target < 0xb; dst_target = dst_target + 1) {
      local_34._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)src_target * 4);
      local_34._4_4_ = *(undefined4 *)(s_valid_targets + (ulong)dst_target * 4);
      test_case.m_src_target = 0;
      test_case.m_dst_target = local_34._4_4_;
      test_case.m_expected_result = local_34._0_4_;
      bVar1 = Utils::isTargetMultisampled(local_34._4_4_);
      bVar2 = Utils::isTargetMultisampled(test_case.m_expected_result);
      if (bVar1 != bVar2) {
        test_case.m_src_target = 0x502;
      }
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_34);
    }
  }
  for (src_target_1 = 0; src_target_1 < 0x11; src_target_1 = src_target_1 + 1) {
    for (dst_target_1 = 0; dst_target_1 < 0x11; dst_target_1 = dst_target_1 + 1) {
      dst_2 = *(GLuint *)(s_invalid_targets + (ulong)src_target_1 * 4);
      src_2 = *(GLuint *)(s_invalid_targets + (ulong)dst_target_1 * 4);
      test_case_1.m_src_target = 0x500;
      test_case_1.m_dst_target = src_2;
      test_case_1.m_expected_result = dst_2;
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)&dst_2);
    }
  }
  for (src_target_2 = 0; src_target_2 < 0x11; src_target_2 = src_target_2 + 1) {
    for (dst_target_2 = 0; dst_target_2 < 0xb; dst_target_2 = dst_target_2 + 1) {
      dst_3 = *(GLuint *)(s_invalid_targets + (ulong)src_target_2 * 4);
      src_3 = *(GLuint *)(s_valid_targets + (ulong)dst_target_2 * 4);
      test_case_2.m_src_target = 0x500;
      test_case_2.m_dst_target = src_3;
      test_case_2.m_expected_result = dst_3;
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)&dst_3);
    }
  }
  for (src_target_3 = 0; src_target_3 < 0xb; src_target_3 = src_target_3 + 1) {
    for (dst_target_3 = 0; dst_target_3 < 0x11; dst_target_3 = dst_target_3 + 1) {
      local_98._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)src_target_3 * 4);
      local_98._4_4_ = *(undefined4 *)(s_invalid_targets + (ulong)dst_target_3 * 4);
      test_case_3.m_src_target = 0x500;
      test_case_3.m_dst_target = local_98._4_4_;
      test_case_3.m_expected_result = local_98._0_4_;
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_98);
    }
  }
  return;
}

Assistant:

InvalidTargetTest::InvalidTargetTest(deqp::Context& context)
	: TestCase(context, "invalid_target",
			   "Test verifies if INVALID_ENUM is generated when invalid target is provided to CopySubImageData")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{

	/* Valid source, valid dst */
	for (GLuint src = 0; src < s_n_valid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum src_target = s_valid_targets[src];
			const GLenum dst_target = s_valid_targets[dst];
			testCase	 test_case  = { src_target, dst_target, GL_NO_ERROR };

			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				test_case.m_expected_result = GL_INVALID_OPERATION;
			}

			m_test_cases.push_back(test_case);
		}
	}

	/* Invalid source, invalid dst */
	for (GLuint src = 0; src < s_n_invalid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_invalid_targets; ++dst)
		{
			const GLenum   src_target = s_invalid_targets[src];
			const GLenum   dst_target = s_invalid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}

	/* Invalid source, valid dst */
	for (GLuint src = 0; src < s_n_invalid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum   src_target = s_invalid_targets[src];
			const GLenum   dst_target = s_valid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}

	/* Valid source, invalid dst */
	for (GLuint src = 0; src < s_n_valid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_invalid_targets; ++dst)
		{
			const GLenum   src_target = s_valid_targets[src];
			const GLenum   dst_target = s_invalid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}
}